

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<int,_ft::allocator<int>_>::deque
          (deque<int,_ft::allocator<int>_> *this,deque<int,_ft::allocator<int>_> *other)

{
  size_type n;
  const_iterator local_78;
  const_iterator local_50;
  deque<int,_ft::allocator<int>_> *local_18;
  deque<int,_ft::allocator<int>_> *other_local;
  deque<int,_ft::allocator<int>_> *this_local;
  
  local_18 = other;
  other_local = this;
  dequeIterator<int,_64UL>::dequeIterator(&this->m_start);
  dequeIterator<int,_64UL>::dequeIterator(&this->m_finish);
  this->m_map = (map_pointer)0x0;
  this->m_map_size = 0;
  this->m_chunks = 0;
  this->m_size = 0;
  get_allocator((deque<int,_ft::allocator<int>_> *)&this->field_0x70);
  n = size(local_18);
  dequeInit(this,n);
  begin(&local_50,local_18);
  end(&local_78,local_18);
  deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
            ((deque<int,ft::allocator<int>> *)this,&local_50,&local_78,(type *)0x0);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_78);
  constDequeIterator<int,_64UL>::~constDequeIterator(&local_50);
  return;
}

Assistant:

deque(deque const & other):
		m_map(NULL),
		m_map_size(0),
		m_chunks(0),
		m_size(0),
		m_alloc(other.get_allocator()) {
		this->dequeInit(other.size());
		this->assign(other.begin(), other.end());
	}